

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O1

void __thiscall mnf::Point::Point(Point *this,Point *other)

{
  Manifold *M;
  double *local_68;
  long lStack_60;
  ConstRefVec local_48;
  
  ConstSubPoint::value(&local_48,&(other->super_SubPoint).super_ConstSubPoint);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
            ((Matrix<double,_1,1,0,_1,1> *)&this->super_PointMemory,&local_48);
  free(local_48.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  this->_vptr_Point = (_func_int **)&PTR_format_00141948;
  M = (other->super_SubPoint).super_ConstSubPoint.manifold_;
  PointMemory::getMem(&this->super_PointMemory);
  local_68 = (this->super_PointMemory).mem_.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  lStack_60 = (this->super_PointMemory).mem_.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (-1 < lStack_60 || local_68 == (double *)0x0) {
    SubPoint::SubPoint(&this->super_SubPoint,M,(RefVec *)&local_68);
    this->_vptr_Point = (_func_int **)&PTR_format_00141948;
    return;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

Point::Point(const Point& other)
    : PointMemory(other.value()), SubPoint(other.getManifold(), getMem())
{
}